

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Module::ForEachInst
          (Module *this,function<void_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  pointer puVar2;
  pointer pIVar3;
  Instruction *i;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *i_11;
  pointer puVar4;
  Instruction *i_12;
  pointer this_00;
  
  pIVar1 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
  {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->extensions_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = (this->memory_model_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar1 != (Instruction *)0x0) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = (this->sampled_image_address_mode_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar1 != (Instruction *)0x0) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
  {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->debugs1_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->debugs3_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
  {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  pIVar1 = &(this->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  while (pIVar1 = *(Instruction **)
                   ((long)&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
        pIVar1 != &(this->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_) {
    Instruction::ForEachInst(pIVar1,f,run_on_debug_line_insts);
  }
  puVar2 = (this->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    Function::ForEachInst
              ((puVar4->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl,f,
               run_on_debug_line_insts,true);
  }
  if (run_on_debug_line_insts) {
    pIVar3 = (this->trailing_dbg_line_info_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->trailing_dbg_line_info_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar3;
        this_00 = this_00 + 1) {
      Instruction::ForEachInst(this_00,f,true);
    }
  }
  return;
}

Assistant:

void Module::ForEachInst(const std::function<void(const Instruction*)>& f,
                         bool run_on_debug_line_insts) const {
#define DELEGATE(i) i.ForEachInst(f, run_on_debug_line_insts)
  for (auto& i : capabilities_) DELEGATE(i);
  for (auto& i : extensions_) DELEGATE(i);
  for (auto& i : ext_inst_imports_) DELEGATE(i);
  if (memory_model_)
    static_cast<const Instruction*>(memory_model_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  if (sampled_image_address_mode_)
    static_cast<const Instruction*>(sampled_image_address_mode_.get())
        ->ForEachInst(f, run_on_debug_line_insts);
  for (auto& i : entry_points_) DELEGATE(i);
  for (auto& i : execution_modes_) DELEGATE(i);
  for (auto& i : debugs1_) DELEGATE(i);
  for (auto& i : debugs2_) DELEGATE(i);
  for (auto& i : debugs3_) DELEGATE(i);
  for (auto& i : annotations_) DELEGATE(i);
  for (auto& i : types_values_) DELEGATE(i);
  for (auto& i : ext_inst_debuginfo_) DELEGATE(i);
  for (auto& i : functions_) {
    static_cast<const Function*>(i.get())->ForEachInst(
        f, run_on_debug_line_insts,
        /* run_on_non_semantic_insts = */ true);
  }
  if (run_on_debug_line_insts) {
    for (auto& i : trailing_dbg_line_info_) DELEGATE(i);
  }
#undef DELEGATE
}